

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_decoding.h
# Opt level: O0

bool draco::DecodeVarint<int>(int *out_val,DecoderBuffer *buffer)

{
  bool bVar1;
  type tVar2;
  uint *in_RSI;
  type *in_RDI;
  type symbol;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  
  bVar1 = anon_unknown_49::DecodeVarintUnsigned<unsigned_int>
                    ((int)in_RDI,in_RSI,
                     (DecoderBuffer *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
  ;
  if (bVar1) {
    tVar2 = ConvertSymbolToSignedInt<unsigned_int>(in_stack_ffffffffffffffe4);
    *in_RDI = tVar2;
  }
  return bVar1;
}

Assistant:

bool DecodeVarint(IntTypeT *out_val, DecoderBuffer *buffer) {
  if (std::is_unsigned<IntTypeT>::value) {
    if (!DecodeVarintUnsigned<IntTypeT>(1, out_val, buffer)) {
      return false;
    }
  } else {
    // IntTypeT is a signed value. Decode the symbol and convert to signed.
    typename std::make_unsigned<IntTypeT>::type symbol;
    if (!DecodeVarintUnsigned(1, &symbol, buffer)) {
      return false;
    }
    *out_val = ConvertSymbolToSignedInt(symbol);
  }
  return true;
}